

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sexp_conflict
sexp_utf8_next(sexp_conflict ctx,sexp_conflict self,sexp_conflict bv,sexp_conflict offset,
              sexp_conflict end)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong in_RCX;
  int *in_RDX;
  long lVar7;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ulong in_R8;
  sexp_sint_t res;
  sexp_sint_t initial;
  sexp_conflict local_78;
  long local_68;
  long local_60;
  sexp_conflict local_8;
  
  if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 8)) {
    if ((in_RCX & 1) == 1) {
      if ((in_R8 & 1) == 1) {
        lVar7 = (long)in_RCX >> 0x3f;
        auVar1._8_8_ = lVar7;
        auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
        auVar2._8_8_ = (long)in_R8 >> 0x3f;
        auVar2._0_8_ = in_R8 & 0xfffffffffffffffe;
        if (SUB168(auVar1 / SEXT816(2),0) < SUB168(auVar2 / SEXT816(2),0)) {
          auVar3._8_8_ = lVar7;
          auVar3._0_8_ = in_RCX & 0xfffffffffffffffe;
          uVar6 = (ulong)*(byte *)((long)in_RDX + SUB168(auVar3 / SEXT816(2),0) + 0x10);
          auVar4._8_8_ = lVar7;
          auVar4._0_8_ = in_RCX & 0xfffffffffffffffe;
          if (uVar6 < 0xc0) {
            local_60 = 1;
          }
          else {
            if (uVar6 < 0xe0) {
              local_68 = 2;
            }
            else {
              local_68 = ((long)uVar6 >> 4 & 1U) + 3;
            }
            local_60 = local_68;
          }
          local_60 = SUB168(auVar4 / SEXT816(2),0) + local_60;
          auVar5._8_8_ = (long)in_R8 >> 0x3f;
          auVar5._0_8_ = in_R8 & 0xfffffffffffffffe;
          if (SUB168(auVar5 / SEXT816(2),0) < local_60) {
            local_78 = (sexp_conflict)0x3e;
          }
          else {
            local_78 = (sexp_conflict)(local_60 * 2 | 1);
          }
          local_8 = local_78;
        }
        else {
          local_8 = (sexp_conflict)0x3e;
        }
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,8,in_RDX);
  }
  return local_8;
}

Assistant:

sexp sexp_utf8_next (sexp ctx, sexp self, sexp bv, sexp offset, sexp end) {
  sexp_sint_t initial, res;
  sexp_assert_type(ctx, sexp_bytesp, SEXP_BYTES, bv);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, offset);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, end);
  if (sexp_unbox_fixnum(offset) >= sexp_unbox_fixnum(end)) return SEXP_FALSE;
  initial = ((unsigned char*)sexp_bytes_data(bv) + sexp_unbox_fixnum(offset))[0];
  res = sexp_unbox_fixnum(offset) + (initial < 0xC0 ? 1 : initial < 0xE0 ? 2 : 3 + ((initial>>4)&1));
  return res > sexp_unbox_fixnum(end) ? SEXP_FALSE : sexp_make_fixnum(res);
}